

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLiSample> * __thiscall
pbrt::GoniometricLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,GoniometricLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  Transform *this_00;
  undefined8 uVar1;
  undefined4 extraout_EDX;
  undefined4 extraout_var;
  float a;
  undefined1 auVar2 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar9 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar8 [64];
  float fVar10;
  undefined1 auVar13 [60];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Point3<float> PVar18;
  Point3f PVar19;
  Vector3<float> VVar20;
  SampledSpectrum SVar21;
  SampledSpectrum local_70;
  Tuple3<pbrt::Point3,_float> local_60;
  Tuple3<pbrt::Vector3,_float> local_50;
  ulong local_40;
  float local_38;
  undefined1 auVar14 [56];
  
  this_00 = &(this->super_LightBase).renderFromLight;
  local_70.values.values[3] = local_70.values.values[1];
  local_70.values.values._0_12_ = ZEXT812(0);
  PVar18 = Transform::operator()(this_00,(Point3<float> *)&local_70);
  auVar3._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar3._8_56_ = in_register_00001208;
  local_40 = vmovlps_avx(auVar3._0_16_);
  local_38 = PVar18.super_Tuple3<pbrt::Point3,_float>.z;
  PVar19 = LightSampleContext::p(&ctx);
  auVar4._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = in_register_00001208;
  auVar2 = vsubps_avx(auVar3._0_16_,auVar4._0_16_);
  auVar9 = ZEXT856(auVar2._8_8_);
  auVar13 = (undefined1  [60])0x0;
  uVar1 = vmovlps_avx(auVar2);
  local_70.values.values[2] =
       PVar18.super_Tuple3<pbrt::Point3,_float>.z - PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  local_70.values.values[0] = (float)(int)uVar1;
  local_70.values.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  VVar20 = Normalize<float>((Vector3<float> *)&local_70);
  fVar10 = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14 = auVar13._4_56_;
  auVar5._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar9;
  auVar16._0_8_ = auVar5._0_8_ ^ 0x8000000080000000;
  auVar16._8_4_ = auVar9._0_4_ ^ 0x80000000;
  auVar16._12_4_ = auVar9._4_4_ ^ 0x80000000;
  local_50.z = -fVar10;
  auVar2._0_8_ = CONCAT44(auVar13._0_4_,fVar10) ^ 0x8000000080000000;
  auVar2._8_4_ = auVar13._4_4_ ^ 0x80000000;
  auVar2._12_4_ = auVar13._8_4_ ^ 0x80000000;
  auVar9 = ZEXT856(auVar2._8_8_);
  local_50._0_8_ = vmovlps_avx(auVar16);
  VVar20 = Transform::ApplyInverse<float>(this_00,(Vector3<float> *)&local_50);
  SVar21 = I(this,(Vector3f)VVar20.super_Tuple3<pbrt::Vector3,_float>,&lambda);
  auVar11._0_8_ = SVar21.values.values._8_8_;
  auVar11._8_56_ = auVar14;
  auVar6._0_8_ = SVar21.values.values._0_8_;
  auVar6._8_56_ = auVar9;
  local_70.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar11._0_16_);
  auVar9 = ZEXT856(local_70.values.values._8_8_);
  PVar19 = LightSampleContext::p(&ctx);
  local_60.z = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
  auVar7._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar9;
  local_60._0_8_ = vmovlps_avx(auVar7._0_16_);
  a = DistanceSquared<float>
                ((pbrt *)&local_40,(Point3<float> *)&local_60,
                 (Point3<float> *)CONCAT44(extraout_var,extraout_EDX));
  auVar9 = extraout_var_00;
  SVar21 = SampledSpectrum::operator/(&local_70,a);
  auVar12._0_8_ = SVar21.values.values._8_8_;
  auVar12._8_56_ = auVar14;
  auVar8._0_8_ = SVar21.values.values._0_8_;
  auVar8._8_56_ = auVar9;
  auVar2 = vmovlhps_avx(auVar8._0_16_,auVar12._0_16_);
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_40;
  auVar17._4_4_ = local_38;
  auVar17._0_4_ = local_38;
  auVar17._8_4_ = local_38;
  auVar17._12_4_ = local_38;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  __return_storage_ptr__->set = true;
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar2;
  auVar2 = vshufps_avx(auVar15,auVar15,0x50);
  uVar1 = vmovlps_avx(auVar5._0_16_);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar10;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar2;
  uVar1 = vmovlps_avx(auVar17);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLiSample> GoniometricLight::SampleLi(LightSampleContext ctx,
                                                         Point2f u,
                                                         SampledWavelengths lambda,
                                                         LightSamplingMode mode) const {
    Point3f p = renderFromLight(Point3f(0, 0, 0));
    Vector3f wi = Normalize(p - ctx.p());
    SampledSpectrum L =
        I(renderFromLight.ApplyInverse(-wi), lambda) / DistanceSquared(p, ctx.p());
    return LightLiSample(L, wi, 1, Interaction(p, &mediumInterface));
}